

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool handleArgument(int *argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  size_t sVar4;
  bool *pbVar5;
  string *psVar6;
  char *pcVar7;
  int iVar8;
  int iVar9;
  
  iVar1 = *argc;
  if (iVar1 < 2) {
    handleArgument();
  }
  else if (0 < *argc) {
    iVar9 = 0;
    do {
      pcVar7 = argv[iVar9];
      sVar4 = strlen(pcVar7);
      iVar8 = iVar9;
      if (1 < sVar4) {
        pcVar7 = pcVar7 + 1;
        iVar3 = strcmp(pcVar7,"plot");
        pbVar5 = &gDoplot;
        psVar6 = &plotName_abi_cxx11_;
        if (iVar3 != 0) {
          iVar3 = strcmp(pcVar7,"out");
          pbVar5 = &gOutfile;
          psVar6 = &outfileName_abi_cxx11_;
          if (iVar3 != 0) goto LAB_001046ee;
        }
        *pbVar5 = true;
        iVar8 = iVar9 + 1;
        pcVar7 = argv[(long)iVar9 + 1];
        pcVar2 = (char *)psVar6->_M_string_length;
        strlen(pcVar7);
        std::__cxx11::string::_M_replace((ulong)psVar6,0,pcVar2,(ulong)pcVar7);
      }
LAB_001046ee:
      iVar9 = iVar8 + 1;
    } while (iVar9 < *argc);
  }
  return 1 < iVar1;
}

Assistant:

bool handleArgument(const int& argc, char** argv) {
  int i = 0;
  if (argc < 2) {
    fprintf(stderr, "Usage: ./steiner <input> [-out <.out>] [-plot <.plt>]\n");
    return false;
  }
  while(i < argc) {
    if (strlen(argv[i]) <= 1) {
      ++i;
      continue;
    }
    else if (strcmp(argv[i] + 1, "plot") == 0) {
      gDoplot = true;
      plotName = argv[++i];
    }
    else if (strcmp(argv[i] + 1, "out") == 0) {
      gOutfile = true;
      outfileName = argv[++i];
    }
    ++i;
  }
  return true;
}